

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_valid_size.c
# Opt level: O2

size_t log_valid_size(size_t size)

{
  ulong uVar1;
  
  if (size != 0) {
    uVar1 = size - 1;
    if ((size & uVar1) == 0) {
      uVar1 = uVar1 >> 1 | uVar1;
      uVar1 = uVar1 >> 2 | uVar1;
      uVar1 = uVar1 >> 4 | uVar1;
      uVar1 = uVar1 >> 8 | uVar1;
      size = (uVar1 >> 0x10 | uVar1) + 1;
    }
    return size;
  }
  return 1;
}

Assistant:

size_t log_valid_size(size_t size)
{
	if (size == 0)
	{
		return 1;
	}

	if (size & (size - 1))
	{
		return size;
	}

	/* Calculate next power of two */
	--size;

	size |= size >> 0x01;
	size |= size >> 0x02;
	size |= size >> 0x04;
	size |= size >> 0x08;
	size |= size >> 0x10;

	++size;

	return size;
}